

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

void __thiscall Database::~Database(Database *this)

{
  int32_t *piVar1;
  IndexTree *in_RDI;
  int i;
  uint local_c;
  
  piVar1 = in_RDI[1].root_node;
  if (piVar1 != (int32_t *)0x0) {
    IndexTree::~IndexTree(in_RDI);
    operator_delete(piVar1);
  }
  for (local_c = 0; local_c < *(uint *)(in_RDI[0x36f].nodes)->key; local_c = local_c + 1) {
    munmap((&in_RDI[0x126].file_map)[(int)local_c],0x2000000);
    close(*(int *)((long)&in_RDI[1].nodes + (long)(int)local_c * 4));
  }
  munmap(in_RDI[0x36f].nodes,0x1000);
  close(*(int *)&in_RDI[0x36f].root_node);
  std::__cxx11::string::~string((string *)&in_RDI[1].index_file_size);
  return;
}

Assistant:

Database::~Database() {
    delete index;
    // unmap all opened files
    for (int i = 0; i < metadata->sliceCount; ++i) {
        munmap(slices[i], SLICE_SIZE);
        close(slice_fd[i]);
    }
    munmap(metadata, 4096);
    close(metadata_fd);
}